

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

int QtPrivate::compareStrings(QStringView lhs,QStringView rhs,CaseSensitivity cs)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  int iVar3;
  ulong blen;
  ulong alen;
  ulong uVar4;
  ulong uVar5;
  
  alen = lhs.m_size;
  blen = rhs.m_size;
  if (cs != CaseSensitive) {
    iVar3 = ucstricmp(alen,lhs.m_data,blen,rhs.m_data);
    return iVar3;
  }
  uVar4 = blen;
  if (alen < blen) {
    uVar4 = alen;
  }
  uVar5 = 0;
  do {
    if (uVar4 == uVar5) {
      iVar3 = (uint)((long)blen < (long)alen) * 2 + -1;
      if (alen == blen) {
        iVar3 = 0;
      }
      return iVar3;
    }
    pcVar1 = lhs.m_data + uVar5;
    pcVar2 = rhs.m_data + uVar5;
    uVar5 = uVar5 + 1;
    iVar3 = (uint)(ushort)*pcVar1 - (uint)(ushort)*pcVar2;
  } while (iVar3 == 0);
  return iVar3;
}

Assistant:

int QtPrivate::compareStrings(QStringView lhs, QStringView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return ucstrcmp(lhs.utf16(), lhs.size(), rhs.utf16(), rhs.size());
    return ucstricmp(lhs.size(), lhs.utf16(), rhs.size(), rhs.utf16());
}